

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

ssize_t __thiscall gguf_writer::write(gguf_writer *this,int __fd,void *__buf,size_t __n)

{
  long *extraout_RAX;
  long *plVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,(char *)CONCAT44(in_register_00000034,__fd),&local_31);
  write(this,(int)(string *)local_30,__buf_00,__n);
  plVar1 = local_20;
  if (local_30[0] != plVar1) {
    operator_delete(local_30[0],local_20[0] + 1);
    plVar1 = extraout_RAX;
  }
  return (ssize_t)plVar1;
}

Assistant:

void write(const char * val) const {
        write(std::string(val));
    }